

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O1

char_t * __thiscall pugi::xpath_variable::name(xpath_variable *this)

{
  switch(this->_type) {
  case xpath_type_node_set:
    return (char_t *)&this[3]._next;
  case xpath_type_number:
  case xpath_type_string:
    return (char_t *)&this[1]._next;
  case xpath_type_boolean:
    return (char_t *)((long)&this[1]._type + 1);
  default:
    return (char_t *)0x0;
  }
}

Assistant:

PUGI_IMPL_FN const char_t* xpath_variable::name() const
	{
		switch (_type)
		{
		case xpath_type_node_set:
			return static_cast<const impl::xpath_variable_node_set*>(this)->name;

		case xpath_type_number:
			return static_cast<const impl::xpath_variable_number*>(this)->name;

		case xpath_type_string:
			return static_cast<const impl::xpath_variable_string*>(this)->name;

		case xpath_type_boolean:
			return static_cast<const impl::xpath_variable_boolean*>(this)->name;

		default:
			assert(false && "Invalid variable type"); // unreachable
			return NULL;
		}
	}